

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hh
# Opt level: O0

string * __thiscall
qpdf::util::hex_encode_char_abi_cxx11_(string *__return_storage_ptr__,util *this,char c)

{
  allocator<char> local_2c;
  undefined1 local_2b;
  char local_2a;
  char local_29;
  undefined1 *local_28;
  undefined8 local_20;
  byte local_11;
  string *psStack_10;
  char c_local;
  
  local_11 = (byte)this;
  local_2b = 0x23;
  local_2a = "0123456789abcdef"[local_11 >> 4];
  local_29 = "0123456789abcdef"[local_11 & 0xf];
  local_28 = &local_2b;
  local_20 = 3;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_28,local_20,&local_2c);
  std::allocator<char>::~allocator(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
    hex_encode_char(char c)
    {
        static auto constexpr hexchars = "0123456789abcdef";
        return {'#', hexchars[static_cast<unsigned char>(c) >> 4], hexchars[c & 0x0f]};
    }